

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void pass2_no_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  JDIMENSION JVar2;
  _func_void_j_decompress_ptr *p_Var3;
  short *psVar4;
  byte *pbVar5;
  byte *pbVar6;
  JDIMENSION local_64;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  int c2;
  int c1;
  int c0;
  histptr cachep;
  JSAMPROW outptr;
  JSAMPROW inptr;
  hist3d histogram;
  my_cquantize_ptr_conflict cquantize;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JSAMPARRAY input_buf_local;
  j_decompress_ptr cinfo_local;
  
  p_Var3 = cinfo->cquantize[1].finish_pass;
  JVar2 = cinfo->output_width;
  for (width = 0; (int)width < num_rows; width = width + 1) {
    outptr = input_buf[(int)width];
    cachep = (histptr)output_buf[(int)width];
    for (local_64 = JVar2; local_64 != 0; local_64 = local_64 - 1) {
      pbVar5 = outptr + 1;
      bVar1 = *outptr;
      pbVar6 = outptr + 2;
      outptr = outptr + 3;
      psVar4 = (short *)(*(long *)(p_Var3 + (long)((int)(uint)bVar1 >> 3) * 8) +
                         (long)((int)(uint)*pbVar5 >> 2) * 0x40 +
                        (long)((int)(uint)*pbVar6 >> 3) * 2);
      if (*psVar4 == 0) {
        fill_inverse_cmap(cinfo,(int)(uint)bVar1 >> 3,(int)(uint)*pbVar5 >> 2,
                          (int)(uint)*pbVar6 >> 3);
      }
      *(char *)cachep = (char)*psVar4 + -1;
      cachep = (histptr)((long)cachep + 1);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
pass2_no_dither (j_decompress_ptr cinfo,
		 JSAMPARRAY input_buf, JSAMPARRAY output_buf, int num_rows)
/* This version performs no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  register JSAMPROW inptr, outptr;
  register histptr cachep;
  register int c0, c1, c2;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    inptr = input_buf[row];
    outptr = output_buf[row];
    for (col = width; col > 0; col--) {
      /* get pixel value and index into the cache */
      c0 = GETJSAMPLE(*inptr++) >> C0_SHIFT;
      c1 = GETJSAMPLE(*inptr++) >> C1_SHIFT;
      c2 = GETJSAMPLE(*inptr++) >> C2_SHIFT;
      cachep = & histogram[c0][c1][c2];
      /* If we have not seen this color before, find nearest colormap entry */
      /* and update the cache */
      if (*cachep == 0)
	fill_inverse_cmap(cinfo, c0,c1,c2);
      /* Now emit the colormap index for this cell */
      *outptr++ = (JSAMPLE) (*cachep - 1);
    }
  }
}